

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::string_t,duckdb::hugeint_t,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStringOperator<duckdb::TryCastToUUID>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  hugeint_t *phVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  unsigned_long *puVar4;
  string_t *psVar5;
  SelectionVector *sel_vector;
  VectorBuffer *pVVar6;
  idx_t iVar7;
  bool bVar8;
  hugeint_t hVar9;
  optional_idx dict_size;
  UnifiedVectorFormat local_78;
  
  VVar1 = input->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    phVar2 = (hugeint_t *)result->data;
    psVar5 = (string_t *)input->data;
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<duckdb::string_t,duckdb::hugeint_t,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStringOperator<duckdb::TryCastToUUID>>
              (psVar5,phVar2,count,&input->validity,&result->validity,dataptr,adds_nulls);
    return;
  }
  if (VVar1 != DICTIONARY_VECTOR) {
    if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      phVar2 = (hugeint_t *)result->data;
      paVar3 = (anon_union_16_2_67f50693_for_value *)input->data;
      puVar4 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      hVar9 = VectorTryCastStringOperator<duckdb::TryCastToUUID>::
              Operation<duckdb::string_t,duckdb::hugeint_t>
                        ((string_t)paVar3->pointer,&result->validity,0,dataptr);
      *phVar2 = hVar9;
      return;
    }
    goto LAB_013cc81f;
  }
  if (errors != CANNOT_ERROR) goto LAB_013cc81f;
  DictionaryVector::VerifyDictionary(input);
  pVVar6 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->buffer);
  local_78.sel = (SelectionVector *)pVVar6[1].data.allocator.ptr;
  if (((Allocator *)local_78.sel == (Allocator *)0xffffffffffffffff) ||
     (iVar7 = optional_idx::GetIndex((optional_idx *)&local_78), count < iVar7 * 2)) {
LAB_013cca4b:
    bVar8 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(input);
    pVVar6 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->auxiliary);
    bVar8 = *(char *)&pVVar6[1]._vptr_VectorBuffer == '\0';
    if (!bVar8) goto LAB_013cca4b;
    phVar2 = (hugeint_t *)result->data;
    psVar5 = (string_t *)pVVar6[1].data.pointer;
    iVar7 = optional_idx::GetIndex((optional_idx *)&local_78);
    FlatVector::VerifyFlatVector((Vector *)(pVVar6 + 1));
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<duckdb::string_t,duckdb::hugeint_t,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStringOperator<duckdb::TryCastToUUID>>
              (psVar5,phVar2,iVar7,(ValidityMask *)&pVVar6[1].data.allocated_size,&result->validity,
               dataptr,adds_nulls);
    DictionaryVector::VerifyDictionary(input);
    pVVar6 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->buffer);
    iVar7 = optional_idx::GetIndex((optional_idx *)&local_78);
    Vector::Dictionary(result,result,iVar7,(SelectionVector *)(pVVar6 + 1),count);
  }
  if (bVar8) {
    return;
  }
LAB_013cc81f:
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,count,&local_78);
  Vector::SetVectorType(result,FLAT_VECTOR);
  sel_vector = local_78.sel;
  phVar2 = (hugeint_t *)result->data;
  FlatVector::VerifyFlatVector(result);
  ExecuteLoop<duckdb::string_t,duckdb::hugeint_t,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStringOperator<duckdb::TryCastToUUID>>
            ((string_t *)local_78.data,phVar2,count,sel_vector,&local_78.validity,&result->validity,
             dataptr,adds_nulls);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}